

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_string.hpp
# Opt level: O1

string * util::slugize_str(string *__return_storage_ptr__,string *__str)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  size_t __n;
  pointer pbVar3;
  pointer pbVar4;
  string *psVar5;
  char cVar6;
  int iVar7;
  undefined8 uVar8;
  char *pcVar9;
  char *__s1;
  long lVar10;
  pointer pbVar11;
  ulong uVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string _slug;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _words;
  long *local_e0 [2];
  long local_d0 [2];
  _Alloc_hider local_c0;
  size_type local_b8;
  char local_b0;
  undefined7 uStack_af;
  undefined8 uStack_a8;
  ulong local_a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  string *local_80;
  size_t local_78;
  string local_70;
  string local_50;
  
  local_c0._M_p = &local_b0;
  local_b8 = 0;
  local_b0 = '\0';
  pcVar2 = (__str->_M_dataplus)._M_p;
  local_80 = __return_storage_ptr__;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + __str->_M_string_length);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"[^A-Za-z0-9]","");
  split(&local_98,&local_50,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    (local_80->_M_dataplus)._M_p = (pointer)&local_80->field_2;
    pcVar2 = (__str->_M_dataplus)._M_p;
    paVar1 = &__str->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 == paVar1) {
      uVar8 = *(undefined8 *)((long)&__str->field_2 + 8);
      (local_80->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
      *(undefined8 *)((long)&local_80->field_2 + 8) = uVar8;
    }
    else {
      (local_80->_M_dataplus)._M_p = pcVar2;
      (local_80->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    }
    local_80->_M_string_length = __str->_M_string_length;
    (__str->_M_dataplus)._M_p = (pointer)paVar1;
    __str->_M_string_length = 0;
    (__str->field_2)._M_local_buf[0] = '\0';
  }
  else {
    if (local_98.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_98.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar12 = 0;
      do {
        __s1 = local_98.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar12]._M_dataplus._M_p;
        cVar6 = *__s1;
        if (cVar6 != '\0') {
          lVar10 = 1;
          pcVar9 = __s1;
          do {
            iVar7 = tolower((int)cVar6);
            *pcVar9 = (char)iVar7;
            __s1 = local_98.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar12]._M_dataplus._M_p;
            pcVar9 = __s1 + lVar10;
            cVar6 = __s1[lVar10];
            lVar10 = lVar10 + 1;
          } while (cVar6 != '\0');
        }
        pbVar4 = local_98.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pbVar3 = local_98.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pbVar11 = local_98.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar12;
        __n = pbVar11->_M_string_length;
        if (__n != 0) {
          lVar10 = (long)local_98.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_98.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          local_a0 = uVar12;
          if ((ulong)(lVar10 >> 5) <= uVar12) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar12);
            goto LAB_00106911;
          }
          local_78 = (local_98.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
          if ((((__n == local_78) &&
               (iVar7 = bcmp(__s1,((local_98.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
                             __n), lVar10 == 0x20)) && (iVar7 == 0)) ||
             ((__n == pbVar4[-1]._M_string_length &&
              (iVar7 = bcmp(__s1,pbVar4[-1]._M_dataplus._M_p,__n), iVar7 == 0)))) {
            std::__cxx11::string::_M_append((char *)&local_c0,(ulong)__s1);
            uVar12 = local_a0;
          }
          else {
            if ((__n == local_78) && (iVar7 = bcmp(__s1,(pbVar3->_M_dataplus)._M_p,__n), iVar7 == 0)
               ) {
              local_e0[0] = local_d0;
              pcVar2 = (pbVar11->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_e0,pcVar2,pcVar2 + pbVar11->_M_string_length);
              std::__cxx11::string::append((char *)local_e0);
              std::__cxx11::string::_M_append((char *)&local_c0,(ulong)local_e0[0]);
            }
            else {
              local_e0[0] = local_d0;
              pcVar2 = (pbVar11->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_e0,pcVar2,pcVar2 + pbVar11->_M_string_length);
              std::__cxx11::string::append((char *)local_e0);
              std::__cxx11::string::_M_append((char *)&local_c0,(ulong)local_e0[0]);
            }
            uVar12 = local_a0;
            if (local_e0[0] != local_d0) {
              operator_delete(local_e0[0],local_d0[0] + 1);
            }
          }
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 < (ulong)((long)local_98.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_98.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    if (local_c0._M_p[local_b8 - 1] == '-') {
      if (local_b8 == 0) {
LAB_00106911:
        uVar8 = std::__throw_out_of_range_fmt
                          ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                           "basic_string::erase");
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_98);
        if (local_c0._M_p != &local_b0) {
          operator_delete(local_c0._M_p,CONCAT71(uStack_af,local_b0) + 1);
        }
        _Unwind_Resume(uVar8);
      }
      local_c0._M_p[local_b8 - 1] = '\0';
      local_b8 = local_b8 - 1;
    }
    (local_80->_M_dataplus)._M_p = (pointer)&local_80->field_2;
    if (local_c0._M_p == &local_b0) {
      (local_80->field_2)._M_allocated_capacity = CONCAT71(uStack_af,local_b0);
      *(undefined8 *)((long)&local_80->field_2 + 8) = uStack_a8;
    }
    else {
      (local_80->_M_dataplus)._M_p = local_c0._M_p;
      (local_80->field_2)._M_allocated_capacity = CONCAT71(uStack_af,local_b0);
    }
    local_80->_M_string_length = local_b8;
    local_b8 = 0;
    local_b0 = '\0';
    local_c0._M_p = &local_b0;
  }
  psVar5 = local_80;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_98);
  if (local_c0._M_p != &local_b0) {
    operator_delete(local_c0._M_p,CONCAT71(uStack_af,local_b0) + 1);
  }
  return psVar5;
}

Assistant:

std::string slugize_str(std::string __str) {
		std::string _slug;
		std::vector<std::string> _words = split(__str, "[^A-Za-z0-9]");

		if (_words.empty())
			return __str;
		
		for (int _word_index = 0; (unsigned int) _word_index < _words.size(); _word_index++) {
			for (int _char_index = 0; _words[_word_index][_char_index]; _char_index++)
				_words[_word_index][_char_index] = tolower(_words[_word_index][_char_index]);

			if (_words[_word_index].empty())
				continue;
			else if ((_words.at(_word_index) == _words.front() && _words.size() == 1) || _words.at(_word_index) == _words.back())
				_slug += _words[_word_index];
			else if (_words.at(_word_index) == _words.front())
				_slug += _words[_word_index] + "-";
			else
				_slug += _words[_word_index] + "-";
		}

		// in case the last caught member is a non-alphanumeric character
		if (_slug.back() == '-')
			_slug.erase(_slug.size() - 1);

		return _slug;
	}